

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZoneCache::CVmTimeZoneCache(CVmTimeZoneCache *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  CVmHashFunc *hash_function;
  CVmHashTable *in_RDI;
  int in_stack_ffffffffffffffbc;
  CVmHashFunc *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int hash_table_size;
  
  hash_table_size = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pvVar1 = operator_new(0x20);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = 0;
  CVmHashFuncCI::CVmHashFuncCI((CVmHashFuncCI *)in_stack_ffffffffffffffc0);
  CVmHashTable::CVmHashTable
            (in_RDI,hash_table_size,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  *(void **)&in_RDI->field_0x18 = pvVar1;
  hash_function = (CVmHashFunc *)operator_new(0x20);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = 0;
  CVmHashFuncCI::CVmHashFuncCI((CVmHashFuncCI *)hash_function);
  CVmHashTable::CVmHashTable
            (in_RDI,(int)((ulong)puVar2 >> 0x20),hash_function,in_stack_ffffffffffffffbc);
  in_RDI[1].table_ = (CVmHashEntry **)hash_function;
  *(undefined4 *)((long)&in_RDI->table_ + 4) = 0;
  *(undefined4 *)&in_RDI->table_ = 0;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0;
  in_RDI[2].table_ = (CVmHashEntry **)0x0;
  in_RDI[1].table_size_ = 0;
  in_RDI[2].table_size_ = 0;
  in_RDI[1].hash_function_ = (CVmHashFunc *)0x0;
  in_RDI->hash_function_ = (CVmHashFunc *)0x0;
  in_RDI->table_size_ = 0;
  return;
}

Assistant:

CVmTimeZoneCache::CVmTimeZoneCache()
{
    /* create the zone tables */
    db_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);
    synth_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);

    /* we haven't loaded our zone database yet */
    index_loaded_ = index_loaded_ok_ = FALSE;
    zone_bytes_ = 0;
    link_bytes_ = 0;
    abbr_tab_ = 0;
    abbr_bytes_ = 0;
    first_loaded_ = 0;

    /* no local time zone established yet */
    local_zone_ = 0;
    local_zone_name_ = 0;
}